

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<bool> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryTransferTo
          (InMemoryDirectory *this,Directory *toDirectory,PathPtr toPath,WriteMode toMode,
          PathPtr fromPath,TransferMode mode)

{
  TransferMode TVar1;
  byte bVar2;
  size_t sVar3;
  String *value;
  Own<const_kj::Directory,_std::nullptr_t> *pOVar4;
  RefOrVoid<const_kj::Directory> pDVar5;
  undefined4 in_register_00000084;
  StringPtr name;
  PathPtr PVar6;
  undefined4 in_stack_00000018;
  undefined4 local_a8;
  undefined4 uStack_a0;
  bool local_81;
  Own<const_kj::Directory,_std::nullptr_t> *local_80;
  Own<const_kj::Directory,_std::nullptr_t> *child;
  StringPtr local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  OwnOwn<const_kj::Directory,_std::nullptr_t> _child1403;
  WriteMode toMode_local;
  Directory *toDirectory_local;
  InMemoryDirectory *this_local;
  PathPtr toPath_local;
  
  _child1403.value.ptr._4_4_ = mode;
  sVar3 = PathPtr::size(&fromPath);
  if (sVar3 < 2) {
    Maybe<bool>::Maybe((Maybe<bool> *)this);
  }
  else {
    value = PathPtr::operator[](&fromPath,0);
    StringPtr::StringPtr(&local_68,value);
    name.content.size_ = (size_t)local_68.content.ptr;
    name.content.ptr = (char *)toDirectory;
    tryGetParent((InMemoryDirectory *)local_58,name,(WriteMode)local_68.content.size_);
    _::readMaybe<kj::Directory_const,decltype(nullptr)>
              ((_ *)local_48,(Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)local_58);
    Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>::~Maybe
              ((Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)local_58);
    pOVar4 = _::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_48);
    if (pOVar4 == (Own<const_kj::Directory,_std::nullptr_t> *)0x0) {
      Maybe<bool>::Maybe((Maybe<bool> *)this);
    }
    else {
      local_80 = _::OwnOwn<const_kj::Directory,_std::nullptr_t>::operator*
                           ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)local_48);
      TVar1 = _child1403.value.ptr._4_4_;
      pDVar5 = Own<const_kj::Directory,_std::nullptr_t>::operator*(local_80);
      sVar3 = PathPtr::size(&fromPath);
      PVar6 = PathPtr::slice(&fromPath,1,sVar3);
      local_a8 = PVar6.parts.ptr._0_4_;
      uStack_a0 = (undefined4)PVar6.parts.size_;
      bVar2 = (**(code **)(((toPath.parts.ptr)->content).ptr + 0xa0))
                        (toPath.parts.ptr,toPath.parts.size_,CONCAT44(in_register_00000084,toMode),
                         TVar1,pDVar5,in_stack_00000018,local_a8,uStack_a0);
      local_81 = (bool)(bVar2 & 1);
      Maybe<bool>::Maybe((Maybe<bool> *)this,&local_81);
    }
    _::OwnOwn<const_kj::Directory,_std::nullptr_t>::~OwnOwn
              ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)local_48);
  }
  return (Maybe<bool>)SUB82(this,0);
}

Assistant:

Maybe<bool> tryTransferTo(const Directory& toDirectory, PathPtr toPath, WriteMode toMode,
                            PathPtr fromPath, TransferMode mode) const override {
    if (fromPath.size() <= 1) {
      // If `fromPath` is in this directory (or *is* this directory) then we don't have any
      // optimizations.
      return kj::none;
    }

    // `fromPath` is in a subdirectory. It could turn out that that subdirectory is not an
    // InMemoryDirectory and is instead something `toDirectory` is friendly with. So let's follow
    // the path.

    KJ_IF_SOME(child, tryGetParent(fromPath[0], WriteMode::MODIFY)) {
      // OK, switch back to tryTransfer() but use the subdirectory.
      return toDirectory.tryTransfer(toPath, toMode,
          *child, fromPath.slice(1, fromPath.size()), mode);
    } else {
      // Hmm, doesn't exist. Fall back to standard path.
      return kj::none;
    }
  }